

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O3

void __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
::socket_acceptor(socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
                  *this,service *srv,int backlog)

{
  io_service *piVar1;
  int iVar2;
  
  (this->super_acceptor)._vptr_acceptor = (_func_int **)&PTR_async_accept_0028a6b0;
  this->srv_ = srv;
  (this->api_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->api_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piVar1 = cppcms::service::get_io_service(srv);
  booster::aio::acceptor::acceptor(&this->acceptor_,piVar1);
  this->stopped_ = false;
  this->tcp_ = false;
  iVar2 = (int)&this->acceptor_;
  booster::aio::basic_io_device::attach(iVar2);
  booster::aio::acceptor::listen(iVar2);
  return;
}

Assistant:

socket_acceptor(cppcms::service &srv,int backlog) :
				srv_(srv),
				acceptor_(srv_.get_io_service()),
				stopped_(false),
				tcp_(false)
			{
				acceptor_.attach(0);
				acceptor_.listen(backlog);
			}